

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libskiwi.cpp
# Opt level: O0

string * __thiscall
skiwi::skiwi_raw_to_string_abi_cxx11_
          (string *__return_storage_ptr__,skiwi *this,uint64_t scm_value,streamsize precision)

{
  streamsize rax;
  shared_ptr<skiwi::environment<skiwi::environment_entry>_> local_1d0 [2];
  int local_1ac;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  uint64_t local_20;
  streamsize precision_local;
  uint64_t scm_value_local;
  
  local_20 = scm_value;
  precision_local = (streamsize)this;
  scm_value_local = (uint64_t)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  local_1ac = (int)std::setprecision((int)local_20);
  std::operator<<(local_198,(_Setprecision)local_1ac);
  rax = precision_local;
  std::shared_ptr<skiwi::environment<skiwi::environment_entry>_>::shared_ptr
            (local_1d0,
             (shared_ptr<skiwi::environment<skiwi::environment_entry>_> *)
             ((anonymous_namespace)::cd + 0x220));
  scheme_runtime(rax,local_198,local_1d0,(repl_data *)((anonymous_namespace)::cd + 0x188),
                 (context *)((anonymous_namespace)::cd + 0x30));
  std::shared_ptr<skiwi::environment<skiwi::environment_entry>_>::~shared_ptr(local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string skiwi_raw_to_string(uint64_t scm_value, std::streamsize precision)
  {
  std::stringstream ss;
  ss << std::setprecision(precision);
  scheme_runtime(scm_value, ss, cd.env, cd.rd, &cd.ctxt);
  return ss.str();
  }